

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O2

void __thiscall Player::Player(Player *this,string *role)

{
  bool bVar1;
  int iVar2;
  short *psVar3;
  ostream *poVar4;
  long lVar5;
  char *pcVar6;
  long lVar7;
  string sStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  lVar7 = 0x264;
  do {
    Ship::Ship((Ship *)((long)(this->playerArea + -2) + 0xe + lVar7));
    lVar7 = lVar7 + 0x20;
  } while (lVar7 != 0x3a4);
  psVar3 = this->enemyArea[1] + 1;
  for (lVar7 = 1; lVar7 != 0xb; lVar7 = lVar7 + 1) {
    for (lVar5 = 0; lVar5 != 10; lVar5 = lVar5 + 1) {
      psVar3[lVar5 + -0x90] = 100;
      psVar3[lVar5] = 0;
    }
    psVar3 = psVar3 + 0xc;
  }
  bVar1 = std::operator==(role,"human");
  this->role = bVar1;
  iVar2 = rand();
  std::__cxx11::to_string(&sStack_58,iVar2 % 99 + 1);
  std::operator+(&local_38,"Player_",&sStack_58);
  std::__cxx11::string::_M_assign((string *)this);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&sStack_58);
  pcVar6 = "AI";
  if (this->role != false) {
    pcVar6 = "Human";
  }
  std::operator<<((ostream *)&std::cout,pcVar6);
  poVar4 = std::operator<<((ostream *)&std::cout," is being created as ");
  getName_abi_cxx11_(&sStack_58,this);
  poVar4 = std::operator<<(poVar4,(string *)&sStack_58);
  std::endl<char,std::char_traits<char>>(poVar4);
  std::__cxx11::string::~string((string *)&sStack_58);
  return;
}

Assistant:

Player::Player(std::string role) {
    for(int i = 1; i <= 10; i++)
        for(int j = 1; j <= 10; j++)
        {
            playerArea[i][j] = Player::FREE_CODE;
            enemyArea[i][j] = Player::UNKNOWN_CODE;
        }
    setRole(role == "human"); //TRUE if human, else FALSE
    setName("Player_" + std::to_string(rand() % 99 + 1)); //name as Player_NN
    initShips();

    //log
    getRole() ? std::cout << "Human" : std::cout << "AI";
    std::cout << " is being created as " << getName() << std::endl;


}